

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_comp_reference_type_context(MACROBLOCKD *xd)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long in_RDI;
  bool bVar7;
  MB_MODE_INFO *edge_mbmi;
  int l_uni_rfc;
  int a_uni_rfc;
  int uni_rfc;
  MV_REFERENCE_FRAME frfl;
  MV_REFERENCE_FRAME frfa;
  int l_sg;
  int a_sg;
  MB_MODE_INFO *inter_mbmi;
  int left_intra;
  int above_intra;
  int left_in_image;
  int above_in_image;
  MB_MODE_INFO *left_mbmi;
  MB_MODE_INFO *above_mbmi;
  int pred_context;
  MB_MODE_INFO *in_stack_ffffffffffffff80;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *mbmi_00;
  bool local_6e;
  bool local_6d;
  int local_6c;
  bool local_62;
  bool local_61;
  MB_MODE_INFO *local_60;
  int local_c;
  
  local_60 = *(MB_MODE_INFO **)(in_RDI + 0x1ed0);
  mbmi = *(MB_MODE_INFO **)(in_RDI + 0x1ec8);
  bVar3 = *(byte *)(in_RDI + 0x1ec0) & 1;
  bVar4 = *(byte *)(in_RDI + 0x1ec1) & 1;
  if ((bVar3 == 0) || (bVar4 == 0)) {
    if ((bVar3 == 0) && (bVar4 == 0)) {
      local_c = 2;
    }
    else {
      if (bVar3 != 0) {
        mbmi = local_60;
      }
      mbmi_00 = mbmi;
      iVar5 = is_inter_block(mbmi);
      if (iVar5 == 0) {
        local_c = 2;
      }
      else {
        iVar5 = has_second_ref(mbmi);
        if (iVar5 == 0) {
          local_c = 2;
        }
        else {
          local_c = has_uni_comp_refs(mbmi_00);
          local_c = local_c << 2;
        }
      }
    }
  }
  else {
    iVar5 = is_inter_block(in_stack_ffffffffffffff80);
    bVar7 = iVar5 == 0;
    iVar5 = is_inter_block(in_stack_ffffffffffffff80);
    if ((bVar7) && (iVar5 == 0)) {
      local_c = 2;
    }
    else if ((bVar7) || (iVar5 == 0)) {
      if (bVar7) {
        local_60 = mbmi;
      }
      iVar5 = has_second_ref(local_60);
      if (iVar5 == 0) {
        local_c = 2;
      }
      else {
        iVar5 = has_uni_comp_refs(in_stack_ffffffffffffff80);
        local_c = iVar5 * 2 + 1;
      }
    }
    else {
      iVar5 = has_second_ref(local_60);
      bVar7 = iVar5 == 0;
      iVar5 = has_second_ref(mbmi);
      cVar1 = local_60->ref_frame[0];
      cVar2 = mbmi->ref_frame[0];
      if ((bVar7) && (iVar5 == 0)) {
        local_61 = '\x04' < cVar1 && cVar1 < '\b';
        local_62 = '\x04' < cVar2 && cVar2 < '\b';
        local_c = (uint)((local_61 != local_62 ^ 0xffU) & 1) * 2 + 1;
      }
      else if ((iVar5 == 0) || (bVar7)) {
        if (bVar7) {
          local_6c = has_uni_comp_refs(in_stack_ffffffffffffff80);
        }
        else {
          local_6c = has_uni_comp_refs(in_stack_ffffffffffffff80);
        }
        if (local_6c == 0) {
          local_c = 1;
        }
        else {
          local_6d = '\x04' < cVar1 && cVar1 < '\b';
          local_6e = '\x04' < cVar2 && cVar2 < '\b';
          local_c = ((local_6d != local_6e ^ 0xffU) & 1) + 3;
        }
      }
      else {
        iVar5 = has_uni_comp_refs(in_stack_ffffffffffffff80);
        iVar6 = has_uni_comp_refs(in_stack_ffffffffffffff80);
        if ((iVar5 == 0) && (iVar6 == 0)) {
          local_c = 0;
        }
        else if ((iVar5 == 0) || (iVar6 == 0)) {
          local_c = 2;
        }
        else {
          local_c = (((cVar1 == '\x05') != (cVar2 == '\x05') ^ 0xffU) & 1) + 3;
        }
      }
    }
  }
  return local_c;
}

Assistant:

int av1_get_comp_reference_type_context(const MACROBLOCKD *xd) {
  int pred_context;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int above_in_image = xd->up_available;
  const int left_in_image = xd->left_available;

  if (above_in_image && left_in_image) {  // both edges available
    const int above_intra = !is_inter_block(above_mbmi);
    const int left_intra = !is_inter_block(left_mbmi);

    if (above_intra && left_intra) {  // intra/intra
      pred_context = 2;
    } else if (above_intra || left_intra) {  // intra/inter
      const MB_MODE_INFO *inter_mbmi = above_intra ? left_mbmi : above_mbmi;

      if (!has_second_ref(inter_mbmi))  // single pred
        pred_context = 2;
      else  // comp pred
        pred_context = 1 + 2 * has_uni_comp_refs(inter_mbmi);
    } else {  // inter/inter
      const int a_sg = !has_second_ref(above_mbmi);
      const int l_sg = !has_second_ref(left_mbmi);
      const MV_REFERENCE_FRAME frfa = above_mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME frfl = left_mbmi->ref_frame[0];

      if (a_sg && l_sg) {  // single/single
        pred_context = 1 + 2 * (!(IS_BACKWARD_REF_FRAME(frfa) ^
                                  IS_BACKWARD_REF_FRAME(frfl)));
      } else if (l_sg || a_sg) {  // single/comp
        const int uni_rfc =
            a_sg ? has_uni_comp_refs(left_mbmi) : has_uni_comp_refs(above_mbmi);

        if (!uni_rfc)  // comp bidir
          pred_context = 1;
        else  // comp unidir
          pred_context = 3 + (!(IS_BACKWARD_REF_FRAME(frfa) ^
                                IS_BACKWARD_REF_FRAME(frfl)));
      } else {  // comp/comp
        const int a_uni_rfc = has_uni_comp_refs(above_mbmi);
        const int l_uni_rfc = has_uni_comp_refs(left_mbmi);

        if (!a_uni_rfc && !l_uni_rfc)  // bidir/bidir
          pred_context = 0;
        else if (!a_uni_rfc || !l_uni_rfc)  // unidir/bidir
          pred_context = 2;
        else  // unidir/unidir
          pred_context =
              3 + (!((frfa == BWDREF_FRAME) ^ (frfl == BWDREF_FRAME)));
      }
    }
  } else if (above_in_image || left_in_image) {  // one edge available
    const MB_MODE_INFO *edge_mbmi = above_in_image ? above_mbmi : left_mbmi;

    if (!is_inter_block(edge_mbmi)) {  // intra
      pred_context = 2;
    } else {                           // inter
      if (!has_second_ref(edge_mbmi))  // single pred
        pred_context = 2;
      else  // comp pred
        pred_context = 4 * has_uni_comp_refs(edge_mbmi);
    }
  } else {  // no edges available
    pred_context = 2;
  }

  assert(pred_context >= 0 && pred_context < COMP_REF_TYPE_CONTEXTS);
  return pred_context;
}